

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

int Fx_ManDivFindCubeFree(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vCubeFree,int *fWarning)

{
  int *piVar1;
  int Var;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint Var_00;
  uint uVar5;
  int *piVar6;
  uint uVar7;
  int *piVar8;
  int local_38;
  int local_34;
  
  piVar6 = vArr1->pArray;
  piVar8 = vArr2->pArray;
  piVar2 = piVar6 + vArr1->nSize;
  piVar1 = piVar8 + vArr2->nSize;
  vCubeFree->nSize = 0;
  iVar4 = 0;
  local_38 = 1;
  local_34 = 0;
LAB_0028b5a4:
  piVar6 = piVar6 + 1;
  do {
    piVar8 = piVar8 + 1;
    while( true ) {
      if ((piVar2 <= piVar6) || (piVar1 <= piVar8)) goto LAB_0028b621;
      iVar3 = *piVar6;
      Var = *piVar8;
      if (iVar3 == Var) {
        local_34 = local_34 + 1;
        goto LAB_0028b5a4;
      }
      if (Var <= iVar3) break;
      piVar6 = piVar6 + 1;
      iVar3 = Abc_Var2Lit(iVar3,iVar4);
      Vec_IntPush(vCubeFree,iVar3);
    }
    if (vCubeFree->nSize == 0) {
      iVar4 = 1;
      local_38 = 0;
    }
    iVar3 = Abc_Var2Lit(Var,local_38);
    Vec_IntPush(vCubeFree,iVar3);
  } while( true );
LAB_0028b621:
  for (; piVar6 < piVar2; piVar6 = piVar6 + 1) {
    iVar3 = Abc_Var2Lit(*piVar6,iVar4);
    Vec_IntPush(vCubeFree,iVar3);
  }
  for (; piVar8 < piVar1; piVar8 = piVar8 + 1) {
    iVar4 = Abc_Var2Lit(*piVar8,local_38);
    Vec_IntPush(vCubeFree,iVar4);
  }
  iVar4 = vCubeFree->nSize;
  if (iVar4 != 3) {
    if (iVar4 == 1) {
      return -1;
    }
    if (iVar4 == 0) {
      puts("The SOP has duplicated cubes.");
    }
    goto LAB_0028b743;
  }
  piVar2 = vCubeFree->pArray;
  iVar4 = Abc_Lit2Var(*piVar2);
  iVar3 = Abc_Lit2Var(piVar2[1]);
  iVar3 = Abc_LitNot(iVar3);
  if (iVar4 == iVar3) {
    iVar4 = Abc_LitIsCompl(*piVar2);
    iVar3 = Abc_LitIsCompl(piVar2[2]);
    uVar7 = (uint)(iVar4 != iVar3);
LAB_0028b6eb:
    Vec_IntDrop(vCubeFree,uVar7);
  }
  else {
    iVar4 = Abc_Lit2Var(piVar2[1]);
    iVar3 = Abc_Lit2Var(piVar2[2]);
    iVar3 = Abc_LitNot(iVar3);
    if (iVar4 == iVar3) {
      iVar4 = Abc_LitIsCompl(piVar2[1]);
      iVar3 = Abc_LitIsCompl(*piVar2);
      uVar7 = (iVar4 != iVar3) + 1;
      goto LAB_0028b6eb;
    }
  }
  if (vCubeFree->nSize == 2) {
    Var_00 = Abc_Lit2Var(*piVar2);
    uVar5 = Abc_Lit2Var(piVar2[1]);
    uVar7 = uVar5;
    if (Var_00 < uVar5) {
      uVar7 = Var_00;
    }
    if (Var_00 <= uVar5) {
      Var_00 = uVar5;
    }
    iVar4 = Abc_Var2Lit(uVar7,0);
    Vec_IntWriteEntry(vCubeFree,0,iVar4);
    iVar4 = Abc_Var2Lit(Var_00,1);
    Vec_IntWriteEntry(vCubeFree,1,iVar4);
  }
LAB_0028b743:
  iVar4 = Vec_IntEntry(vCubeFree,0);
  iVar4 = Abc_LitIsCompl(iVar4);
  if (iVar4 == 0) {
    return local_34;
  }
  __assert_fail("!Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcFx.c"
                ,0x277,"int Fx_ManDivFindCubeFree(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int *)");
}

Assistant:

int Fx_ManDivFindCubeFree( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = Vec_IntArray( vArr1 ) + 1;  // skip variable ID
    int * pBeg2 = Vec_IntArray( vArr2 ) + 1;  // skip variable ID
    int * pEnd1 = Vec_IntLimit( vArr1 );
    int * pEnd2 = Vec_IntLimit( vArr2 );
    int Counter = 0, fAttr0 = 0, fAttr1 = 1;
    Vec_IntClear( vCubeFree );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            pBeg1++, pBeg2++, Counter++;
        else if ( *pBeg1 < *pBeg2 )
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
        else  
        {
            if ( Vec_IntSize(vCubeFree) == 0 )
                fAttr0 = 1, fAttr1 = 0;
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
        }
    }
    while ( pBeg1 < pEnd1 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
    while ( pBeg2 < pEnd2 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
    if ( Vec_IntSize(vCubeFree) == 0 )
        printf( "The SOP has duplicated cubes.\n" );
    else if ( Vec_IntSize(vCubeFree) == 1 )
        return -1;
    else if ( Vec_IntSize( vCubeFree ) == 3 )
    {
        int * pArray = Vec_IntArray( vCubeFree ); 

        if ( Abc_Lit2Var( pArray[0] ) == Abc_LitNot( Abc_Lit2Var( pArray[1] ) ) )
        {
            if ( Abc_LitIsCompl( pArray[0] ) == Abc_LitIsCompl( pArray[2] ) )
                Vec_IntDrop( vCubeFree, 0 );
            else
                Vec_IntDrop( vCubeFree, 1 );
        }
        else if ( Abc_Lit2Var( pArray[1] ) == Abc_LitNot( Abc_Lit2Var( pArray[2] ) ) )
        {
            if ( Abc_LitIsCompl( pArray[1] ) == Abc_LitIsCompl( pArray[0] ) )
                Vec_IntDrop( vCubeFree, 1 );
            else
                Vec_IntDrop( vCubeFree, 2 );
        }

        if ( Vec_IntSize( vCubeFree ) == 2 )
        {
            int Lit0 = Abc_Lit2Var( pArray[0] ),
                Lit1 = Abc_Lit2Var( pArray[1] );

            if ( Lit0 > Lit1 )
                ABC_SWAP( int, Lit0, Lit1 );

            Vec_IntWriteEntry( vCubeFree, 0, Abc_Var2Lit( Lit0, 0 ) );
            Vec_IntWriteEntry( vCubeFree, 1, Abc_Var2Lit( Lit1, 1 ) );
        }
    }
    assert( !Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0)) );
    return Counter;
}